

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O0

void __thiscall args::Group::Reset(Group *this)

{
  bool bVar1;
  reference ppBVar2;
  Group *in_RDI;
  Base **child;
  const_iterator __end2;
  const_iterator __begin2;
  vector<args::Base_*,_std::allocator<args::Base_*>_> *__range2;
  vector<args::Base_*,_std::allocator<args::Base_*>_> *in_stack_ffffffffffffffc8;
  __normal_iterator<args::Base_*const_*,_std::vector<args::Base_*,_std::allocator<args::Base_*>_>_>
  local_18;
  vector<args::Base_*,_std::allocator<args::Base_*>_> *local_10;
  
  Base::Reset(&in_RDI->super_Base);
  local_10 = Children(in_RDI);
  local_18._M_current =
       (Base **)std::vector<args::Base_*,_std::allocator<args::Base_*>_>::begin
                          (in_stack_ffffffffffffffc8);
  std::vector<args::Base_*,_std::allocator<args::Base_*>_>::end(in_stack_ffffffffffffffc8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<args::Base_*const_*,_std::vector<args::Base_*,_std::allocator<args::Base_*>_>_>
                        *)in_RDI,
                       (__normal_iterator<args::Base_*const_*,_std::vector<args::Base_*,_std::allocator<args::Base_*>_>_>
                        *)in_stack_ffffffffffffffc8);
    if (!bVar1) break;
    ppBVar2 = __gnu_cxx::
              __normal_iterator<args::Base_*const_*,_std::vector<args::Base_*,_std::allocator<args::Base_*>_>_>
              ::operator*(&local_18);
    (*(*ppBVar2)->_vptr_Base[0xe])();
    __gnu_cxx::
    __normal_iterator<args::Base_*const_*,_std::vector<args::Base_*,_std::allocator<args::Base_*>_>_>
    ::operator++(&local_18);
  }
  return;
}

Assistant:

virtual void Reset() noexcept override
            {
                Base::Reset();

                for (auto &child: Children())
                {
                    child->Reset();
                }
#ifdef ARGS_NOEXCEPT
                error = Error::None;
                errorMsg.clear();
#endif
            }